

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double calc_correction_factor(double err_per_mb,int q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar5;
  double error_term;
  double divisor;
  int index;
  double power_term;
  
  iVar4 = in_EDI >> 4;
  dVar1 = q_div_term[iVar4];
  dVar2 = q_div_term[iVar4 + 1];
  dVar3 = q_div_term[iVar4];
  dVar5 = pow(in_XMM0_Qa,0.9);
  return (dVar5 * 1250000.0) / (dVar1 + ((dVar2 - dVar3) * (double)(in_EDI % 0x10)) / 16.0);
}

Assistant:

static double calc_correction_factor(double err_per_mb, int q) {
  double power_term = 0.90;
  const int index = q >> 4;
  const double divisor =
      q_div_term[index] +
      (((q_div_term[index + 1] - q_div_term[index]) * (q % 16)) / 16.0);
  double error_term = EPMB_SCALER * pow(err_per_mb, power_term);
  return error_term / divisor;
}